

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipcm.c
# Opt level: O0

UINT8 device_start_multipcm(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  UINT32 UVar1;
  MultiPCM *ptChip_00;
  float fVar2;
  float fcent;
  float exp_volume;
  float db;
  float pan_vol_db_1;
  float pan_vol_db;
  INT32 inverted_pan;
  float pan_right;
  float pan_left;
  INT32 pan;
  float total_level;
  float vol_db;
  INT32 level;
  INT32 i;
  MultiPCM *ptChip;
  DEV_INFO *retDevInf_local;
  DEV_GEN_CFG *cfg_local;
  
  ptChip_00 = (MultiPCM *)calloc(1,0x2658);
  if (ptChip_00 == (MultiPCM *)0x0) {
    cfg_local._7_1_ = 0xff;
  }
  else {
    ptChip_00->ROM = (UINT8 *)0x0;
    ptChip_00->ROMSize = 0;
    ptChip_00->ROMMask = 0;
    ptChip_00->rate = (float)cfg->clock / 224.0;
    if (IsInit == '\0') {
      IsInit = '\x01';
      for (total_level = 0.0; (int)total_level < 0x80; total_level = (float)((int)total_level + 1))
      {
        fVar2 = powf(10.0,(((float)(int)total_level * -24.0) / 64.0) / 20.0);
        for (pan_right = 0.0; (int)pan_right < 0x10; pan_right = (float)((int)pan_right + 1)) {
          if (pan_right == 1.12104e-44) {
            inverted_pan = 0;
            pan_vol_db = 0.0;
          }
          else if (pan_right == 0.0) {
            inverted_pan = 0x3f800000;
            pan_vol_db = 1.0;
          }
          else if (((uint)pan_right & 8) == 0) {
            inverted_pan = (INT32)powf(10.0,(((float)(int)pan_right * -12.0) / 4.0) / 20.0);
            pan_vol_db = 1.0;
            if (((uint)pan_right & 7) == 7) {
              inverted_pan = 0;
            }
          }
          else {
            inverted_pan = 0x3f800000;
            pan_vol_db = powf(10.0,(((float)(int)(0x10U - (int)pan_right) * -12.0) / 4.0) / 20.0);
            if ((0x10U - (int)pan_right & 7) == 7) {
              pan_vol_db = 0.0;
            }
          }
          UVar1 = value_to_fixed(0xc,(float)inverted_pan * (fVar2 / 4.0));
          left_pan_table[(int)((int)pan_right << 7 | (uint)total_level)] = UVar1;
          UVar1 = value_to_fixed(0xc,pan_vol_db * (fVar2 / 4.0));
          right_pan_table[(int)((int)pan_right << 7 | (uint)total_level)] = UVar1;
        }
      }
      for (vol_db = 0.0; (int)vol_db < 0x400; vol_db = (float)((int)vol_db + 1)) {
        fVar2 = powf(10.0,-(96.0 - ((float)(int)vol_db * 96.0) / 1024.0) / 20.0);
        UVar1 = value_to_fixed(0xc,fVar2);
        linear_to_exp_volume[(int)vol_db] = UVar1;
      }
      lfo_init();
    }
    for (vol_db = 0.0; (int)vol_db < 0x400; vol_db = (float)((int)vol_db + 1)) {
      UVar1 = value_to_fixed(0xc,(ptChip_00->rate * ((float)(int)vol_db + 1024.0)) / 1024.0);
      *(UINT32 *)((long)ptChip_00->freq_step_table + (long)(int)vol_db * 4) = UVar1;
    }
    envelope_generator_init(ptChip_00,BASE_TIMES,14.32833);
    ptChip_00->total_level_steps[0] = -0x98;
    *(INT32 *)((long)ptChip_00->total_level_steps + 4) = 0x4c;
    multipcm_set_mute_mask(ptChip_00,0);
    ptChip_00->_devData = (DEV_DATA)ptChip_00;
    INIT_DEVINF(retDevInf,(DEV_DATA *)ptChip_00,(UINT32)(long)ptChip_00->rate,&devDef);
    cfg_local._7_1_ = '\0';
  }
  return cfg_local._7_1_;
}

Assistant:

static UINT8 device_start_multipcm(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	MultiPCM *ptChip;
	INT32 i;

	ptChip = (MultiPCM *)calloc(1, sizeof(MultiPCM));
	if (ptChip == NULL)
		return 0xFF;
	
	ptChip->ROM = NULL;
	ptChip->ROMSize = 0x00;
	ptChip->ROMMask = 0x00;
	ptChip->rate = (float)cfg->clock / MULTIPCM_CLOCKDIV;

	if (! IsInit)
	{
	INT32 level;

	IsInit = 1;

	// Volume + pan table
	for (level = 0; level < 0x80; ++level)
	{
		const float vol_db = (float)level * (-24.0f) / 64.0f;
		const float total_level = powf(10.0f, vol_db / 20.0f) / 4.0f;
		INT32 pan;

		for (pan = 0; pan < 0x10; ++pan)
		{
			float pan_left, pan_right;
			if (pan == 0x8)
			{
				pan_left = 0.0;
				pan_right = 0.0;
			}
			else if (pan == 0x0)
			{
				pan_left = 1.0;
				pan_right = 1.0;
			}
			else if (pan & 0x8)
			{
				const INT32 inverted_pan = 0x10 - pan;
				const float pan_vol_db = (float)inverted_pan * (-12.0f) / 4.0f;

				pan_left = 1.0;
				pan_right = powf(10.0f, pan_vol_db / 20.0f);

				if ((inverted_pan & 0x7) == 7)
				{
					pan_right = 0.0;
				}
			}
			else
			{
				const float pan_vol_db = (float)pan * (-12.0f) / 4.0f;

				pan_left = powf(10.0f, pan_vol_db / 20.0f);
				pan_right = 1.0;

				if ((pan & 0x7) == 7)
				{
					pan_left = 0.0;
				}
			}

			left_pan_table[(pan << 7) | level] = value_to_fixed(TL_SHIFT, pan_left * total_level);
			right_pan_table[(pan << 7) | level] = value_to_fixed(TL_SHIFT, pan_right * total_level);
		}
	}

	// build the linear->exponential ramps
	for(i = 0; i < 0x400; ++i)
	{
		const float db = -(96.0f - (96.0f * (float)i / (float)0x400));
		const float exp_volume = powf(10.0f, db / 20.0f);
		linear_to_exp_volume[i] = value_to_fixed(TL_SHIFT, exp_volume);
	}

	lfo_init();
	}

	// Pitch steps
	for (i = 0; i < 0x400; ++i)
	{
		const float fcent = ptChip->rate * (1024.0f + (float)i) / 1024.0f;
		ptChip->freq_step_table[i] = value_to_fixed(TL_SHIFT, fcent);
	}

	// Envelope steps
	envelope_generator_init(ptChip, BASE_TIMES, 14.32833);

	// Total level interpolation steps
	ptChip->total_level_steps[0] = -(float)(0x80 << TL_SHIFT) / (78.2f * 44100.0f / 1000.0f); // lower
	ptChip->total_level_steps[1] = (float)(0x80 << TL_SHIFT) / (78.2f * 2 * 44100.0f / 1000.0f); // raise

	multipcm_set_mute_mask(ptChip, 0x00);

	ptChip->_devData.chipInf = ptChip;
	INIT_DEVINF(retDevInf, &ptChip->_devData, (UINT32)ptChip->rate, &devDef);

	return 0x00;
}